

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLpColMatrix(HighsLogOptions *log_options,HighsLp *lp)

{
  int *index;
  int *start;
  int *in_RSI;
  undefined8 in_RDI;
  HighsInt *in_stack_ffffffffffffff70;
  HighsInt *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *message;
  HighsLogOptions *in_stack_ffffffffffffff90;
  string local_68 [8];
  double *in_stack_ffffffffffffffa0;
  undefined1 local_31 [33];
  int *local_10;
  
  if (0 < *in_RSI) {
    local_10 = in_RSI;
    if (in_RSI[1] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Column",(allocator *)&stack0xffffffffffffff97);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)*local_10);
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4fea94);
      reportMatrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (HighsInt)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   (HighsInt)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    }
    else {
      message = (string *)local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_31 + 1),"Column",(allocator *)message);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)*local_10);
      index = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x4fe96c);
      start = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x4fe985);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x4fe99e);
      reportMatrix(in_stack_ffffffffffffff90,message,(HighsInt)((ulong)in_RDI >> 0x20),
                   (HighsInt)in_RDI,start,index,in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string((string *)(local_31 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_31);
    }
  }
  return;
}

Assistant:

void reportLpColMatrix(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_col_ <= 0) return;
  if (lp.num_row_) {
    // With positive number of rows, can assume that there are index and value
    // vectors to pass
    reportMatrix(log_options, "Column", lp.num_col_,
                 lp.a_matrix_.start_[lp.num_col_], lp.a_matrix_.start_.data(),
                 lp.a_matrix_.index_.data(), lp.a_matrix_.value_.data());
  } else {
    // With no rows, can's assume that there are index and value vectors to pass
    reportMatrix(log_options, "Column", lp.num_col_,
                 lp.a_matrix_.start_[lp.num_col_], lp.a_matrix_.start_.data(),
                 NULL, NULL);
  }
}